

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>::
emplaceValue<QtInstallDirectoryWithTriple>
          (Node<QString,_QtInstallDirectoryWithTriple> *this,QtInstallDirectoryWithTriple *args)

{
  bool bVar1;
  qsizetype qVar2;
  Data *pDVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  Data<QHashPrivate::Node<QString,_QString>_> *__old_val;
  long in_FS_OFFSET;
  QHash<QString,_QString> local_70;
  QArrayData *local_68;
  char16_t *pcStack_60;
  qsizetype local_58;
  QHash<QString,_QString> local_50;
  QArrayData *local_48;
  char16_t *local_40;
  qsizetype local_38;
  undefined1 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = (args->qtInstallDirectory).d.size;
  pDVar3 = (args->qtDirectories).d;
  (args->qtInstallDirectory).d.size = 0;
  (args->qtDirectories).d = (Data *)0x0;
  qVar4 = (args->triple).d.size;
  (args->triple).d.size = 0;
  bVar1 = args->enabled;
  pDVar5 = (args->qtInstallDirectory).d.d;
  pcVar6 = (args->qtInstallDirectory).d.ptr;
  (args->qtInstallDirectory).d.d = (Data *)0x0;
  (args->qtInstallDirectory).d.ptr = (char16_t *)0x0;
  local_58 = (this->value).qtInstallDirectory.d.size;
  (this->value).qtInstallDirectory.d.size = qVar2;
  local_50.d = (Data *)0x0;
  pDVar7 = (args->triple).d.d;
  pcVar8 = (args->triple).d.ptr;
  (args->triple).d.d = (Data *)0x0;
  (args->triple).d.ptr = (char16_t *)0x0;
  local_68 = &((this->value).qtInstallDirectory.d.d)->super_QArrayData;
  pcStack_60 = (this->value).qtInstallDirectory.d.ptr;
  (this->value).qtInstallDirectory.d.d = pDVar5;
  (this->value).qtInstallDirectory.d.ptr = pcVar6;
  local_70.d = (this->value).qtDirectories.d;
  (this->value).qtDirectories.d = pDVar3;
  local_30 = bVar1;
  QHash<QString,_QString>::~QHash(&local_70);
  local_48 = &((this->value).triple.d.d)->super_QArrayData;
  local_40 = (this->value).triple.d.ptr;
  (this->value).triple.d.d = pDVar7;
  (this->value).triple.d.ptr = pcVar8;
  local_38 = (this->value).triple.d.size;
  (this->value).triple.d.size = qVar4;
  (this->value).enabled = bVar1;
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,0x10);
    }
  }
  QHash<QString,_QString>::~QHash(&local_50);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }